

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,ModuleInstantiationStmt *stmt)

{
  uint64_t *puVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  __node_base _Var6;
  pointer pbVar7;
  undefined8 uVar8;
  int iVar9;
  ostream *poVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  iterator iVar14;
  Generator *pGVar15;
  Generator *pGVar16;
  long *plVar17;
  VarException *this_00;
  ModuleInstantiationStmt *pMVar18;
  SystemVerilogCodeGen *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar19 [8];
  undefined7 uVar22;
  string *psVar20;
  _Rb_tree_node_base *p_Var21;
  bool bVar23;
  char cVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  string_view sVar28;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 local_288 [8];
  map<kratos::Var_*,_kratos::Stmt_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  debug_info;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>_>
  params_;
  string value;
  long local_1f0 [2];
  char local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 auStack_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  param_names;
  undefined1 local_190 [40];
  long local_168 [2];
  char local_158;
  long *local_150 [2];
  long local_140 [2];
  char local_130;
  long *local_128;
  size_t local_120;
  long local_118 [2];
  char local_108;
  long *local_100;
  size_t local_f8;
  long local_f0 [2];
  char local_e0;
  string local_d8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_b8;
  pointer pcStack_a0;
  ModuleInstantiationStmt *local_98;
  size_type sStack_90;
  ostream *local_80;
  _Rb_tree_node_base *local_78;
  key_type *local_70;
  ModuleInstantiationStmt *local_68;
  Generator *local_60;
  undefined1 local_58 [39];
  undefined1 local_31;
  
  local_58._24_8_ = this;
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    sVar28 = indent(this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar28._M_str,
                         sVar28._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"// ",3);
    strip_newline((string *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  &(stmt->super_Stmt).super_IRNode.comment);
    this = (SystemVerilogCodeGen *)local_58._24_8_;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count
                         ,(long)params_._M_h._M_buckets);
    puVar2 = &(((Stream *)((long)this + 0xe8))->super_stringstream).field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    local_b8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_b8.
                           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_b8,1);
    if ((size_type *)debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        &params_._M_h._M_bucket_count) {
      operator_delete((void *)debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      params_._M_h._M_bucket_count + 1);
    }
  }
  (stmt->super_Stmt).super_IRNode.verilog_ln =
       *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  poVar10 = (ostream *)&(this->stream_).super_stringstream.field_0x10;
  sVar28 = indent(this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,sVar28._M_str,sVar28._M_len);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(stmt->target_->name)._M_dataplus._M_p,(stmt->target_->name)._M_string_length);
  pGVar15 = stmt->target_;
  std::
  _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
              *)local_288,&(stmt->super_InstantiationStmt).port_debug_._M_t);
  debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&params_._M_h._M_rehash_policy._M_next_resize;
  params_._M_h._M_buckets = (__buckets_ptr)0x1;
  params_._M_h._M_bucket_count = 0;
  params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  params_._M_h._M_element_count._0_4_ = 0x3f800000;
  params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  params_._M_h._M_rehash_policy._4_4_ = 0;
  params_._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var12 = (pGVar15->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar20 = (string *)&(pGVar15->params_)._M_t._M_impl.super__Rb_tree_header;
  local_80 = poVar10;
  local_78 = (_Rb_tree_node_base *)psVar20;
  local_58._16_8_ = stmt;
  if (p_Var12 != (_Base_ptr)psVar20) {
    do {
      lVar4 = *(long *)(p_Var12 + 2);
      if (((*(long *)(lVar4 + 0x368) != 0) || ((*(byte *)(lVar4 + 0x380) & 1) == 0)) ||
         (*(long *)(lVar4 + 0x378) != *(long *)(lVar4 + 0x270))) {
        iVar3 = *(int *)(lVar4 + 0x2c0);
        if (iVar3 == 3) {
          local_190[0x10] = '\0';
          bVar23 = *(char *)(lVar4 + 0x3a8) == '\x01';
          if (bVar23) {
            param_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_190;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &param_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*(long *)(lVar4 + 0x388),
                       *(long *)(lVar4 + 0x390) + *(long *)(lVar4 + 0x388));
          }
          uVar22 = (undefined7)((ulong)psVar20 >> 8);
          cVar24 = local_158;
          local_190[0x10] = bVar23;
          if (bVar23) {
            lVar4 = *(long *)(p_Var12 + 2);
            local_158 = 0;
            cVar24 = *(char *)(lVar4 + 0x3d0) == '\x01';
            if (!(bool)cVar24) goto LAB_0021bf79;
            local_190._24_8_ = local_168;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_190 + 0x18),*(long *)(lVar4 + 0x3b0),
                       *(long *)(lVar4 + 0x3b8) + *(long *)(lVar4 + 0x3b0));
            lVar4 = *(long *)(p_Var12 + 2);
            local_108 = 0;
            bVar25 = *(char *)(lVar4 + 0x3a8) == '\x01';
            local_158 = cVar24;
            if (bVar25) {
              local_128 = local_118;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,*(long *)(lVar4 + 0x388),
                         *(long *)(lVar4 + 0x390) + *(long *)(lVar4 + 0x388));
            }
            lVar4 = *(long *)(p_Var12 + 2);
            local_e0 = 0;
            bVar26 = *(char *)(lVar4 + 0x3d0) == '\x01';
            local_108 = bVar25;
            if (bVar26) {
              local_100 = local_f0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,*(long *)(lVar4 + 0x3b0),
                         *(long *)(lVar4 + 0x3b8) + *(long *)(lVar4 + 0x3b0));
            }
            bVar5 = true;
            local_e0 = bVar26;
            if (local_120 != local_f8) goto LAB_0021bf7b;
            if (local_120 != 0) {
              iVar9 = bcmp(local_128,local_100,local_120);
              bVar5 = true;
              if (iVar9 != 0) goto LAB_0021bf7b;
            }
            bVar5 = true;
            bVar26 = false;
            bVar25 = false;
            bVar23 = true;
            uVar13 = CONCAT71(uVar22,1);
          }
          else {
LAB_0021bf79:
            local_158 = cVar24;
            bVar5 = false;
LAB_0021bf7b:
            lVar4 = *(long *)(p_Var12 + 2);
            local_130 = 0;
            bVar26 = *(char *)(lVar4 + 0x3a8) == '\x01';
            if (bVar26) {
              local_150[0] = local_140;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_150,*(long *)(lVar4 + 0x388),
                         *(long *)(lVar4 + 0x390) + *(long *)(lVar4 + 0x388));
              bVar25 = true;
              local_130 = bVar26;
              goto LAB_0021bfd6;
            }
            lVar4 = *(long *)(p_Var12 + 2);
            local_1e0 = 0;
            bVar27 = *(char *)(lVar4 + 0x3d0) == '\x01';
            local_130 = bVar26;
            if (bVar27) {
              value.field_2._8_8_ = local_1f0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((long)&value.field_2 + 8),*(long *)(lVar4 + 0x3b0),
                         *(long *)(lVar4 + 0x3b8) + *(long *)(lVar4 + 0x3b0));
            }
            uVar13 = CONCAT71(uVar22,bVar27);
            bVar26 = true;
            bVar25 = true;
            local_1e0 = bVar27;
          }
        }
        else {
          bVar25 = false;
          bVar5 = false;
          bVar23 = false;
LAB_0021bfd6:
          bVar26 = false;
          uVar13 = 0;
        }
        if (((bVar26) && (local_1e0 == '\x01')) &&
           (local_1e0 = '\0', (long *)value.field_2._8_8_ != local_1f0)) {
          local_70 = (key_type *)CONCAT44(local_70._4_4_,(int)uVar13);
          operator_delete((void *)value.field_2._8_8_,local_1f0[0] + 1);
          uVar13 = (ulong)local_70 & 0xffffffff;
        }
        if (((bVar25) && (local_130 == '\x01')) && (local_130 = '\0', local_150[0] != local_140)) {
          operator_delete(local_150[0],local_140[0] + 1);
        }
        stmt = (ModuleInstantiationStmt *)local_58._16_8_;
        if (bVar5) {
          if ((local_e0 == '\x01') && (local_e0 = '\0', local_100 != local_f0)) {
            operator_delete(local_100,local_f0[0] + 1);
          }
          if ((local_108 == '\x01') && (local_108 = '\0', local_128 != local_118)) {
            operator_delete(local_128,local_118[0] + 1);
          }
        }
        if (((bVar23) && (local_158 == '\x01')) &&
           (local_158 = '\0', (long *)local_190._24_8_ != local_168)) {
          operator_delete((void *)local_190._24_8_,local_168[0] + 1);
        }
        poVar10 = local_80;
        if (((iVar3 == 3) && (local_190[0x10] == '\x01')) &&
           (local_190[0x10] = '\0',
           param_names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_190)) {
          operator_delete(param_names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (ulong)(local_190._0_8_ + 1));
        }
        psVar20 = (string *)&local_b8;
        if ((char)uVar13 == '\0') {
          pMVar18 = *(ModuleInstantiationStmt **)(p_Var12 + 2);
          local_b8.
          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)&local_b8.
                                super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                        + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    (psVar20,*(long *)(p_Var12 + 1),
                     (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
          local_98 = pMVar18;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Param*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Param*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,kratos::Param*>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Param*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Param*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar20);
          if (local_b8.
              super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)((long)&local_b8.
                               super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                       + 0x10U)) {
            operator_delete(local_b8.
                            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)(_Hash_node_base **)
                                          local_b8.
                                          super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != local_78);
  }
  if (params_._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    this_01 = (SystemVerilogCodeGen *)local_58._24_8_;
  }
  else {
    auStack_1b8 = (undefined1  [8])0x0;
    param_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    param_names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_1b8,(size_type)params_._M_h._M_before_begin._M_nxt);
    uVar8 = local_58._24_8_;
    if (params_._M_h._M_bucket_count != 0) {
      plVar17 = (long *)params_._M_h._M_bucket_count;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (plVar17 + 1));
        plVar17 = (long *)*plVar17;
      } while (plVar17 != (long *)0x0);
    }
    stmt = (ModuleInstantiationStmt *)local_58._16_8_;
    pbVar7 = param_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar19 = auStack_1b8;
    if (auStack_1b8 !=
        (undefined1  [8])
        param_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = (long)param_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_1b8 >> 5;
      lVar4 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (auStack_1b8,
                 param_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (auVar19,pbVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," #(",3);
    puVar2 = &(((Stream *)(uVar8 + 0xe8))->super_stringstream).field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    local_b8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_b8.
                           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_b8,1);
    puVar1 = (uint64_t *)(uVar8 + 0x10);
    *puVar1 = *puVar1 + 1;
    local_70 = param_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_1b8 !=
        (undefined1  [8])
        param_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var21 = (_Rb_tree_node_base *)0x1;
      auVar19 = auStack_1b8;
      do {
        iVar14 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)auVar19);
        if (iVar14.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        Param::value_str_abi_cxx11_
                  ((string *)&params_._M_h._M_single_bucket,
                   *(Param **)
                    ((long)iVar14.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_true>
                           ._M_cur + 0x28));
        plVar17 = *(long **)(*(long *)((long)iVar14.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_true>
                                             ._M_cur + 0x28) + 0x368);
        if (plVar17 != (long *)0x0) {
          pGVar15 = (Generator *)(**(code **)(*plVar17 + 0x68))(plVar17);
          pGVar16 = Stmt::generator_parent(&stmt->super_Stmt);
          if (pGVar15 != pGVar16) {
            this_00 = (VarException *)__cxa_allocate_exception(0x10);
            pGVar16 = Stmt::generator_parent(&stmt->super_Stmt);
            local_b8.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)(pGVar15->name)._M_dataplus._M_p;
            local_b8.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)(pGVar15->name)._M_string_length;
            local_b8.
            super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar17[0xf];
            pcStack_a0 = (pointer)plVar17[0x10];
            local_98 = (ModuleInstantiationStmt *)(pGVar16->name)._M_dataplus._M_p;
            sStack_90 = (pGVar16->name)._M_string_length;
            format_str_00.size_ = 0xddd;
            format_str_00.data_ = (char *)0x28;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args_00.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)&local_b8;
            fmt::v7::detail::vformat_abi_cxx11_
                      (&local_d8,(detail *)"{0}.{1} is not declared in generator {2}",format_str_00,
                       args_00);
            local_68 = (ModuleInstantiationStmt *)local_58._16_8_;
            __l._M_len = 3;
            __l._M_array = (iterator)&local_68;
            local_60 = pGVar15;
            local_58._0_8_ = plVar17;
            std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                      (&local_b8,__l,(allocator_type *)(local_58 + 0x26));
            VarException::VarException(this_00,&local_d8,&local_b8);
            __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        sVar28 = indent((SystemVerilogCodeGen *)local_58._24_8_);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_80,sVar28._M_str,sVar28._M_len);
        _Var6 = params_._M_h._M_before_begin;
        local_31 = (_Rb_tree_node_base *)params_._M_h._M_before_begin._M_nxt != p_Var21;
        local_78 = p_Var21;
        if ((_Rb_tree_node_base *)params_._M_h._M_before_begin._M_nxt == p_Var21) {
          local_68 = (ModuleInstantiationStmt *)local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,")","");
        }
        else {
          puVar2 = &(((Stream *)(local_58._24_8_ + 0xe8))->super_stringstream).field_0x90;
          *(long *)puVar2 = *(long *)puVar2 + 1;
          local_1d8[0] = local_1c8;
          std::__cxx11::string::_M_construct((ulong)local_1d8,'\x01');
          plVar17 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x23b26c);
          local_68 = (ModuleInstantiationStmt *)local_58;
          pMVar18 = (ModuleInstantiationStmt *)(plVar17 + 2);
          if ((ModuleInstantiationStmt *)*plVar17 == pMVar18) {
            local_58._0_8_ = (pMVar18->super_Stmt).super_IRNode._vptr_IRNode;
            local_58._8_8_ = plVar17[3];
          }
          else {
            local_58._0_8_ = (pMVar18->super_Stmt).super_IRNode._vptr_IRNode;
            local_68 = (ModuleInstantiationStmt *)*plVar17;
          }
          local_60 = (Generator *)plVar17[1];
          *plVar17 = (long)pMVar18;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
        }
        local_b8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((key_type *)auVar19)->_M_dataplus)._M_p;
        local_b8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((key_type *)auVar19)->_M_string_length;
        local_b8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)params_._M_h._M_single_bucket;
        pcStack_a0 = value._M_dataplus._M_p;
        local_98 = local_68;
        sStack_90 = (size_type)local_60;
        format_str.size_ = 0xddd;
        format_str.data_ = (char *)0xc;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_b8;
        fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)".{0}({1}){2}",format_str,args);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        poVar10 = local_80;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_68 != (ModuleInstantiationStmt *)local_58) {
          operator_delete(local_68,local_58._0_8_ + 1);
        }
        stmt = (ModuleInstantiationStmt *)local_58._16_8_;
        if (((_Rb_tree_node_base *)_Var6._M_nxt != local_78) && (local_1d8[0] != local_1c8)) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
        if (params_._M_h._M_single_bucket != (__node_base_ptr)&value._M_string_length) {
          operator_delete(params_._M_h._M_single_bucket,value._M_string_length + 1);
        }
        auVar19 = (undefined1  [8])((long)auVar19 + 0x20);
        p_Var21 = (_Rb_tree_node_base *)(ulong)((int)p_Var21 + 1);
      } while (auVar19 != (undefined1  [8])local_70);
    }
    this_01 = (SystemVerilogCodeGen *)local_58._24_8_;
    puVar2 = &(((Stream *)(local_58._24_8_ + 0xe8))->super_stringstream).field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    local_b8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_b8.
                           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_b8,1);
    puVar1 = (uint64_t *)((long)this_01 + 0x10);
    *puVar1 = *puVar1 - 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_1b8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,(stmt->target_->instance_name)._M_dataplus._M_p,
             (stmt->target_->instance_name)._M_string_length);
  generate_port_interface(this_01,&stmt->super_InstantiationStmt);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Param_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&debug_info._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
  ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Stmt_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>_>
               *)local_288);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(ModuleInstantiationStmt* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << stmt->target()->name;
    const auto& params = stmt->target()->get_params();
    auto debug_info = stmt->port_debug();

    // pre-filter the parameters if the initial value is the same as the current value
    std::unordered_map<std::string, Param*> params_;
    for (auto const& [name, param] : params) {
        if (!param->parent_param() && param->get_initial_value() &&
            (*param->get_initial_value()) == param->value()) {
            continue;
        }
        // could be raw string type as well
        if (param->param_type() == ParamType::RawType &&
            ((param->get_raw_str_value() && param->get_raw_str_initial_value() &&
              (*param->get_raw_str_value()) == (*param->get_raw_str_initial_value())) ||
             (!param->get_raw_str_value() && param->get_raw_str_initial_value()))) {
            continue;
        }
        params_.emplace(std::make_pair(name, param.get()));
    }

    if (!params_.empty()) {
        std::vector<std::string> param_names;
        param_names.reserve(params_.size());
        for (auto const& iter : params_) {
            param_names.emplace_back(iter.first);
        }
        std::sort(param_names.begin(), param_names.end());
        stream_ << " #(" << stream_.endl();
        indent_++;

        uint32_t count = 0;
        for (auto const& name : param_names) {
            auto const& param = params_.at(name);
            auto value = param->value_str();
            if (param->parent_param()) {
                const auto* p = param->parent_param();
                // checking on parameter parent
                auto* p_gen = p->generator();
                if (p_gen != stmt->generator_parent()) {
                    throw VarException(
                        ::format("{0}.{1} is not declared in generator {2}", p_gen->name, p->name,
                                 stmt->generator_parent()->name),
                        {stmt, p_gen, p});
                }
            }
            stream_ << indent()
                    << ::format(
                           ".{0}({1}){2}", name, value,
                           ++count == params_.size() ? ")" : "," + std::string(1, stream_.endl()));
        }

        // start a new line
        stream_ << stream_.endl();
        indent_--;
    } else {
        stream_ << " ";
    }
    stream_ << stmt->target()->instance_name;
    generate_port_interface(stmt);
}